

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_seckey_verify(secp256k1_context *ctx,uchar *seckey)

{
  int overflow;
  secp256k1_scalar sec;
  int local_3c;
  secp256k1_scalar local_38;
  
  secp256k1_scalar_set_b32(&local_38,seckey,&local_3c);
  return (int)((((local_38.d[1] != 0 || local_38.d[0] != 0) || local_38.d[2] != 0) ||
               local_38.d[3] != 0) && local_3c == 0);
}

Assistant:

int secp256k1_ec_seckey_verify(const secp256k1_context* ctx, const unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_clear(&sec);
    return ret;
}